

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O3

void init_robot(int i)

{
  robots[i].status = 0;
  robots[i].x = 0;
  robots[i].y = 0;
  robots[i].org_x = 0;
  robots[i].org_y = 0;
  robots[i].range = 0;
  robots[i].last_x = -1;
  robots[i].last_y = -1;
  robots[i].speed = 0;
  robots[i].last_speed = -1;
  robots[i].accel = 0;
  robots[i].d_speed = 0;
  robots[i].heading = 0;
  robots[i].last_heading = -1;
  robots[i].d_heading = 0;
  robots[i].damage = 0;
  robots[i].last_damage = -1;
  robots[i].scan = 0;
  robots[i].last_scan = -1;
  robots[i].reload = 0;
  missiles[i][0].stat = 0;
  ((missile *)((long)(missiles + i) + 0))->last_xx = -1;
  ((missile *)((long)(missiles + i) + 0))->last_yy = -1;
  missiles[i][1].stat = 0;
  ((missile *)((long)(missiles + i) + 0x2c))->last_xx = -1;
  ((missile *)((long)(missiles + i) + 0x2c))->last_yy = -1;
  return;
}

Assistant:

void init_robot(int i)
{
	 int j;

	robots[i].status = DEAD;
	robots[i].x = 0;
	robots[i].y = 0;
	robots[i].org_x = 0;
	robots[i].org_y = 0;
	robots[i].range = 0;
	robots[i].last_x = -1;
	robots[i].last_y = -1;
	robots[i].speed = 0;
	robots[i].last_speed = -1;
	robots[i].accel = 0;
	robots[i].d_speed = 0;
	robots[i].heading = 0;
	robots[i].last_heading = -1;
	robots[i].d_heading = 0;
	robots[i].damage = 0;
	robots[i].last_damage = -1;
	robots[i].scan = 0;
	robots[i].last_scan = -1;
	robots[i].reload = 0;
	for (j = 0; j < MIS_ROBOT; j++) {
		missiles[i][j].stat = AVAIL;
		missiles[i][j].last_xx = -1;
		missiles[i][j].last_yy = -1;
	}
}